

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int __thiscall CNumber<30>::shortest(CNumber<30> *this,type *right)

{
  bool bVar1;
  int iVar2;
  type *right_local;
  CNumber<30> *this_local;
  
  bVar1 = operator<(this,right);
  if (bVar1) {
    this_local._4_4_ = shortest_helper(this,right);
  }
  else {
    iVar2 = shortest_helper(right,this);
    this_local._4_4_ = -iVar2;
  }
  return this_local._4_4_;
}

Assistant:

int shortest(const type& right) const
        {
            // 1, 20 mod 30
            // 20 - 1 = 19
            // 1 - 20 = -19 mod 30 = 11
            if (*this < right)
            {
                return shortest_helper(right);
            }
            return -right.shortest_helper(*this);
        }